

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

number_validator<double> __thiscall goodform::sub_form::float64(sub_form *this)

{
  bool bVar1;
  undefined8 *in_RSI;
  double extraout_XMM0_Qa;
  number_validator<double> nVar2;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  double local_20;
  double val;
  sub_form *this_local;
  
  this_local = this;
  bVar1 = convert<double>((any *)in_RSI[1],&local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NOT A float64",&local_61);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=((error_message *)*in_RSI,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  number_validator<double>::number_validator
            ((number_validator<double> *)this,local_20,(error_message *)*in_RSI);
  nVar2.value_ = extraout_XMM0_Qa;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<double> sub_form::float64()
  {
    double val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A float64");
    return number_validator<double>(val, this->error_);
  }